

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O3

void __thiscall
compress_tests::compress_p2pk_scripts_not_on_curve::test_method
          (compress_p2pk_scripts_not_on_curve *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uchar *puVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long lVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 local_241;
  undefined1 local_240 [16];
  undefined1 *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  bool success;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  bool done;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  assertion_result local_1a8;
  undefined1 **local_190;
  _func_int ****local_188;
  lazy_ostream local_180;
  undefined1 *local_170;
  _func_int *****local_168;
  _func_int ****local_160;
  char *local_158;
  assertion_result local_150;
  undefined1 local_138 [24];
  undefined8 uStack_120;
  uint local_118 [2];
  undefined1 local_110 [36];
  uint local_ec;
  undefined1 local_e8 [36];
  uint local_c4;
  direct_or_indirect local_c0;
  uint local_a4;
  CPubKey pubkey_not_on_curve;
  XOnlyPubKey x_not_on_curve;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  do {
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_not_on_curve,
               &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                super_RandomMixin<FastRandomContext>,0x20);
    puVar4 = (uchar *)CONCAT71(pubkey_not_on_curve.vch._1_7_,pubkey_not_on_curve.vch[0]);
    if (pubkey_not_on_curve.vch._8_8_ - (long)puVar4 != 0x20) {
      __assert_fail("vch.size() == WIDTH",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                    ,0x2a,"base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]");
    }
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)puVar4;
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)(puVar4 + 8);
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)(puVar4 + 0x10);
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)(puVar4 + 0x18);
    operator_delete(puVar4,pubkey_not_on_curve.vch._16_8_ - (long)puVar4);
    bVar3 = XOnlyPubKey::IsFullyValid(&x_not_on_curve);
  } while (bVar3);
  puVar4 = (uchar *)operator_new(0x41);
  puVar4[0x21] = '\0';
  puVar4[0x22] = '\0';
  puVar4[0x23] = '\0';
  puVar4[0x24] = '\0';
  puVar4[0x25] = '\0';
  puVar4[0x26] = '\0';
  puVar4[0x27] = '\0';
  puVar4[0x28] = '\0';
  puVar4[0x29] = '\0';
  puVar4[0x2a] = '\0';
  puVar4[0x2b] = '\0';
  puVar4[0x2c] = '\0';
  puVar4[0x2d] = '\0';
  puVar4[0x2e] = '\0';
  puVar4[0x2f] = '\0';
  puVar4[0x30] = '\0';
  puVar4[0x31] = '\0';
  puVar4[0x32] = '\0';
  puVar4[0x33] = '\0';
  puVar4[0x34] = '\0';
  puVar4[0x35] = '\0';
  puVar4[0x36] = '\0';
  puVar4[0x37] = '\0';
  puVar4[0x38] = '\0';
  puVar4[0x39] = '\0';
  puVar4[0x3a] = '\0';
  puVar4[0x3b] = '\0';
  puVar4[0x3c] = '\0';
  puVar4[0x3d] = '\0';
  puVar4[0x3e] = '\0';
  puVar4[0x3f] = '\0';
  puVar4[0x40] = '\0';
  *puVar4 = '\x04';
  *(undefined8 *)(puVar4 + 1) = x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_
  ;
  *(undefined8 *)(puVar4 + 9) = x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_
  ;
  *(undefined8 *)(puVar4 + 0x11) =
       x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)(puVar4 + 0x19) =
       x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_;
  CPubKey::Set<unsigned_char_const*>(&pubkey_not_on_curve,puVar4,puVar4 + 0x41);
  if ((((pubkey_not_on_curve.vch[0] & 0xfe) != 2) && (1 < pubkey_not_on_curve.vch[0] - 6)) &&
     (pubkey_not_on_curve.vch[0] != '\x04')) {
    __assert_fail("pubkey_not_on_curve.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
                  ,0x94,"void compress_tests::compress_p2pk_scripts_not_on_curve::test_method()");
  }
  bVar3 = CPubKey::IsFullyValid(&pubkey_not_on_curve);
  if (bVar3) {
    __assert_fail("!pubkey_not_on_curve.IsFullyValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
                  ,0x95,"void compress_tests::compress_p2pk_scripts_not_on_curve::test_method()");
  }
  local_e8._16_8_ = 0;
  local_e8._24_8_ = 0;
  local_e8._0_8_ = (char *)0x0;
  local_e8._8_8_ = 0;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,&pubkey_not_on_curve
            );
  this_00 = &CScript::operator<<((CScript *)local_e8,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110)
             ->super_CScriptBase;
  uVar1 = this_00->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar5 = this_00;
  }
  local_180._vptr_lazy_ostream = (_func_int **)CONCAT71(local_180._vptr_lazy_ostream._1_7_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar5->_union + (long)(int)uVar2),(uchar *)&local_180);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_c0.indirect_contents,this_00
            );
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ - local_110._0_8_);
  }
  if (0x1c < (uint)local_e8._28_4_) {
    free((void *)local_e8._0_8_);
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x97;
  file.m_begin = (iterator)&local_1c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d0,msg);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_170 = boost::unit_test::lazy_ostream::inst;
  uVar1 = local_a4 - 0x1d;
  if (local_a4 < 0x1d) {
    uVar1 = local_a4;
  }
  local_168 = (_func_int *****)0xf73bdc;
  local_160 = (_func_int ****)CONCAT44(local_160._4_4_,uVar1);
  local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(uVar1 == 0x43);
  local_150._0_8_ = &local_188;
  local_188 = (_func_int ****)CONCAT44(local_188._4_4_,0x43);
  local_1a8.m_message.px = (element_type *)0x0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_138._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
       + 0x60;
  local_e8._24_8_ = local_240;
  local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_110[8] = '\0';
  local_110._0_8_ = &PTR__lazy_ostream_013ae108;
  local_110._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_240._0_8_ = &local_160;
  local_110._24_8_ = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,&local_180,1,2,REQUIRE,0xe75aa9,(size_t)local_138,0x97,(CScript *)local_e8,
             "67U",(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  local_e8._16_8_ = 0;
  local_e8._24_8_ = 0;
  local_e8._0_8_ = (char *)0x0;
  local_e8._8_8_ = 0;
  local_e8[0x20] = '\0';
  local_c4 = 0;
  done = CompressScript((CScript *)&local_c0.indirect_contents,(CompressedScript *)local_e8);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x9b;
  file_00.m_begin = (iterator)&local_1e8;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1f8,
             msg_00);
  local_1a8.m_message.px = (element_type *)((ulong)local_1a8.m_message.px & 0xffffffffffffff00);
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_190 = (undefined1 **)0xf73bdc;
  local_188 = (_func_int ****)((ulong)local_188 & 0xffffffffffffff00);
  local_150._0_8_ = &done;
  local_138._0_8_ = CONCAT71(local_138._1_7_,done) ^ 1;
  local_138._8_8_ = (element_type *)0x0;
  local_138._16_8_ = (sp_counted_base *)0x0;
  local_240._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_240._8_8_ = "";
  local_110[8] = '\0';
  local_110._0_8_ = &PTR__lazy_ostream_013ae3e8;
  local_110._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_160 = (_func_int ****)&local_188;
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae3e8;
  local_170 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_168 = &local_160;
  local_110._24_8_ = &local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_138,(lazy_ostream *)&local_1a8,1,2,REQUIRE,0xfc5f87,
             (size_t)local_240,0x9b,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,"false",&local_180);
  boost::detail::shared_count::~shared_count((shared_count *)(local_138 + 0x10));
  prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector<unsigned_char_*>
            ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)local_110,(uchar *)&x_not_on_curve,
             (uchar *)&local_38);
  local_118[0] = 4;
  local_118[1] = 5;
  lVar8 = 0;
  do {
    local_138._16_8_ = (sp_counted_base *)0x0;
    uStack_120 = 0;
    local_138._0_8_ = (char *)0x0;
    local_138._8_8_ = (element_type *)0x0;
    success = DecompressScript((CScript *)local_138,*(uint *)((long)local_118 + lVar8),
                               (CompressedScript *)local_110);
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
    ;
    local_208 = "";
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xa3;
    file_01.m_begin = (iterator)&local_210;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_220,
               msg_01);
    local_240._8_8_ = local_240._8_8_ & 0xffffffffffffff00;
    local_240._0_8_ = &PTR__lazy_ostream_013ae088;
    local_230 = boost::unit_test::lazy_ostream::inst;
    local_228 = "";
    local_241 = 0;
    local_150._0_8_ = CONCAT71(local_150._1_7_,success) ^ 1;
    local_150.m_message.px = (element_type *)0x0;
    local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_160 = (_func_int ****)0xe75932;
    local_158 = "";
    local_188 = (_func_int ****)&success;
    local_180.m_empty = false;
    local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae3e8;
    local_170 = boost::unit_test::lazy_ostream::inst;
    local_168 = &local_188;
    local_1b0 = &local_241;
    local_1a8.m_message.px = (element_type *)((ulong)local_1a8.m_message.px & 0xffffffffffffff00);
    local_1a8._0_8_ = &PTR__lazy_ostream_013ae3e8;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_190 = &local_1b0;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_150,(lazy_ostream *)local_240,1,2,REQUIRE,0xf49394,(size_t)&local_160,0xa3,
               &local_180,"false",&local_1a8);
    boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
    if (0x1c < uStack_120._4_4_) {
      free((void *)local_138._0_8_);
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 8);
  if (0x21 < local_ec) {
    free((void *)local_110._0_8_);
  }
  if (0x21 < local_c4) {
    free((void *)local_e8._0_8_);
  }
  if (0x1c < local_a4) {
    free(local_c0.indirect_contents.indirect);
  }
  operator_delete(puVar4,0x41);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_p2pk_scripts_not_on_curve)
{
    XOnlyPubKey x_not_on_curve;
    do {
        x_not_on_curve = XOnlyPubKey(m_rng.randbytes(32));
    } while (x_not_on_curve.IsFullyValid());

    // Check that P2PK script with uncompressed pubkey [=> OP_PUSH65 <0x04 .....> OP_CHECKSIG]
    // which is not fully valid (i.e. point is not on curve) can't be compressed
    std::vector<unsigned char> pubkey_raw(65, 0);
    pubkey_raw[0] = 4;
    std::copy(x_not_on_curve.begin(), x_not_on_curve.end(), &pubkey_raw[1]);
    CPubKey pubkey_not_on_curve(pubkey_raw);
    assert(pubkey_not_on_curve.IsValid());
    assert(!pubkey_not_on_curve.IsFullyValid());
    CScript script = CScript() << ToByteVector(pubkey_not_on_curve) << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(script.size(), 67U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, false);

    // Check that compressed P2PK script with uncompressed pubkey that is not fully
    // valid (i.e. x coordinate of the pubkey is not on curve) can't be decompressed
    CompressedScript compressed_script(x_not_on_curve.begin(), x_not_on_curve.end());
    for (unsigned int compression_id : {4, 5}) {
        CScript uncompressed_script;
        bool success = DecompressScript(uncompressed_script, compression_id, compressed_script);
        BOOST_CHECK_EQUAL(success, false);
    }
}